

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySet.cxx
# Opt level: O0

void __thiscall
cmInstallRuntimeDependencySet::TargetItem::AddPostExcludeFiles
          (TargetItem *this,string *config,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,cmInstallRuntimeDependencySet *set)

{
  bool bVar1;
  cmGeneratorTarget *tgt;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *this_00;
  reference ppcVar2;
  value_type *__x;
  string local_68;
  cmGeneratorTarget *local_48;
  cmGeneratorTarget *dep;
  iterator __end1;
  iterator __begin1;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range1;
  cmInstallRuntimeDependencySet *set_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *config_local;
  TargetItem *this_local;
  
  tgt = cmInstallTargetGenerator::GetTarget(this->Target);
  this_00 = anon_unknown.dwarf_f88fa6::GetTargetDependsClosure(&set->TargetDepends,tgt);
  __end1 = std::
           set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
           ::begin(this_00);
  dep = (cmGeneratorTarget *)
        std::
        set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
        ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&dep);
    if (!bVar1) break;
    ppcVar2 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end1);
    local_48 = *ppcVar2;
    cmGeneratorTarget::GetFullPath(&local_68,local_48,config,RuntimeBinaryArtifact,false);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
              *)files,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_68,__x);
    std::__cxx11::string::~string((string *)&local_68);
    std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void cmInstallRuntimeDependencySet::TargetItem::AddPostExcludeFiles(
  const std::string& config, std::set<std::string>& files,
  cmInstallRuntimeDependencySet* set) const
{
  for (auto const* dep : GetTargetDependsClosure(set->TargetDepends,
                                                 this->Target->GetTarget())) {
    files.insert(dep->GetFullPath(config));
  }
}